

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O2

string * __thiscall
Json::JsonParser::parseNull_abi_cxx11_(string *__return_storage_ptr__,JsonParser *this,char prev)

{
  int iVar1;
  JsonReader *this_00;
  int iVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  JsonException *this_01;
  int iVar6;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->__buffer_value)._M_string_length = 0;
  *(this->__buffer_value)._M_dataplus._M_p = '\0';
  this_00 = &this->__reader;
  while( true ) {
    JsonReader::substr_abi_cxx11_(&local_70,this_00,3,false);
    std::operator+(&local_50,prev,&local_70);
    bVar3 = std::operator==(&local_50,"null");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar3) {
      std::__cxx11::string::append((char *)this);
      iVar2 = (this->__reader).__ptr;
      iVar6 = (this->__reader).__len;
      iVar1 = iVar2 + 3;
      if (iVar1 < iVar6) {
        iVar6 = iVar1;
      }
      if (iVar2 < -2) {
        iVar6 = 0;
      }
      (this->__reader).__ptr = iVar6;
    }
    cVar4 = JsonReader::peek(this_00);
    if (((cVar4 == ',') || (cVar4 == ']')) || (cVar4 == '}')) break;
    bVar5 = JsonReader::get(this_00);
    if ((0x20 < bVar5) || ((0x100002600U >> ((ulong)bVar5 & 0x3f) & 1) == 0)) {
      this_01 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_01,this_00);
      __cxa_throw(this_01,&JsonException::typeinfo,JsonException::~JsonException);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(this->__buffer_value)._M_dataplus._M_p,
             (allocator<char> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Json::JsonParser::parseNull(char prev) {
    buffer_reset();
    for (;;) {
        if (prev + __reader.substr(3) == "null") {
            buffer_append("null");
            __reader.moveTo(3);
        }
        char c = __reader.peek();
        if (c == JSON_SEPARATE || c == JSON_OBJECT_END || c == JSON_ARRAY_END) {
            break;
        } else if (is_space_char(__reader.get()))continue;
        else throw JsonException(__reader);
    }
    return buffer_str();
}